

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.c
# Opt level: O3

cio_error cio_eventloop_run(cio_eventloop *loop)

{
  cio_event_notifier *evn;
  uint uVar1;
  int *piVar2;
  cio_epoll_error cStack_40;
  
  do {
    while (uVar1 = epoll_wait(loop->epoll_fd,(epoll_event *)loop->epoll_events,100,-1),
          -1 < (int)uVar1) {
      loop->num_events = uVar1;
      loop->event_counter = 0;
      if (uVar1 != 0) {
        uVar1 = 0;
        do {
          evn = (cio_event_notifier *)loop->epoll_events[uVar1].data.u64;
          if (evn == &loop->stop_ev) {
            return CIO_SUCCESS;
          }
          uVar1 = loop->epoll_events[uVar1].events;
          loop->current_ev = evn;
          if ((((evn->registered_events & uVar1 & 1) == 0) ||
              ((*evn->read_callback)(evn->context,CIO_EPOLL_SUCCESS),
              loop->current_ev != (cio_event_notifier *)0x0)) &&
             ((uVar1 & evn->registered_events & 4) != 0)) {
            cStack_40 = CIO_EPOLL_SUCCESS;
            if ((uVar1 & 0x18) != 0) {
              cStack_40 = CIO_EPOLL_ERROR;
            }
            uVar1 = evn->registered_events & 0xfffffffb;
            evn->registered_events = uVar1;
            epoll_mod((cio_eventloop *)(ulong)(uint)loop->epoll_fd,evn,uVar1);
            (*evn->write_callback)(evn->context,cStack_40);
          }
          uVar1 = loop->event_counter + 1;
          loop->event_counter = uVar1;
        } while (uVar1 < loop->num_events);
      }
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  return -*piVar2;
}

Assistant:

enum cio_error cio_eventloop_run(struct cio_eventloop *loop)
{
	struct epoll_event *events = loop->epoll_events;

	while (true) {
		int num_events =
		    epoll_wait(loop->epoll_fd, events, CONFIG_MAX_EPOLL_EVENTS, -1);

		if (cio_unlikely(num_events < 0)) {
			if (errno == EINTR) {
				continue;
			}

			return (enum cio_error)(-errno);
		}

		loop->num_events = (unsigned int)num_events;
		for (loop->event_counter = 0; loop->event_counter < loop->num_events; loop->event_counter++) {
			struct cio_event_notifier *evn = events[loop->event_counter].data.ptr;
			if (cio_unlikely(evn == &loop->stop_ev)) {
				goto out;
			}

			uint32_t events_type = events[loop->event_counter].events;
			loop->current_ev = evn;

			if ((events_type & (uint32_t)EPOLLIN & evn->registered_events) != 0) {
				evn->read_callback(evn->context, CIO_EPOLL_SUCCESS);
			}

			handle_removed_ev(loop, evn, events_type);
		}
	}

out:
	return CIO_SUCCESS;
}